

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coctx.cpp
# Opt level: O3

int coctx_make(coctx_t *ctx,coctx_pfn_t pfn,void *s,void *s1)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)((ulong)(ctx->ss_sp + (ctx->ss_size - 8)) & 0xfffffffffffffff0);
  ctx->regs[0] = (void *)0x0;
  ctx->regs[1] = (void *)0x0;
  ctx->regs[2] = (void *)0x0;
  ctx->regs[3] = (void *)0x0;
  ctx->regs[4] = (void *)0x0;
  ctx->regs[5] = (void *)0x0;
  ctx->regs[6] = (void *)0x0;
  ctx->regs[7] = (void *)0x0;
  ctx->regs[8] = (void *)0x0;
  ctx->regs[9] = (void *)0x0;
  ctx->regs[10] = (void *)0x0;
  ctx->regs[0xb] = (void *)0x0;
  ctx->regs[0xc] = (void *)0x0;
  *puVar1 = pfn;
  ctx->regs[0xd] = puVar1;
  ctx->regs[9] = pfn;
  ctx->regs[7] = s;
  ctx->regs[8] = s1;
  return 0;
}

Assistant:

int coctx_make(coctx_t* ctx, coctx_pfn_t pfn, const void* s, const void* s1) {
  char* sp = ctx->ss_sp + ctx->ss_size - sizeof(void*);
  sp = (char*)((unsigned long)sp & -16LL);

  memset(ctx->regs, 0, sizeof(ctx->regs));
  void** ret_addr = (void**)(sp);
  *ret_addr = (void*)pfn;

  ctx->regs[kRSP] = sp;

  ctx->regs[kRETAddr] = (char*)pfn;

  ctx->regs[kRDI] = (char*)s;
  ctx->regs[kRSI] = (char*)s1;
  return 0;
}